

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::calcCrossProductsStates
          (BeagleCPUImpl<float,_1,_0> *this,int *tipStates,float *preOrderPartial,
          double *categoryRates,float *categoryWeights,double edgeLength,double *outCrossProducts,
          double *outSumSquaredDerivatives)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  undefined1 auVar4 [16];
  uint uVar5;
  uint uVar6;
  undefined1 auVar7 [16];
  BeagleCPUImpl<float,_1,_0> *pBVar8;
  long lVar9;
  pointer pfVar10;
  long lVar11;
  double *pdVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  float *pfVar18;
  long lVar19;
  bool bVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [64];
  undefined1 auVar27 [16];
  undefined1 in_ZMM4 [64];
  vector<float,_std::allocator<float>_> tmp;
  allocator_type local_99;
  long local_98;
  float *local_90;
  long local_88;
  value_type_conflict3 local_7c;
  BeagleCPUImpl<float,_1,_0> *local_78;
  double local_70;
  double *local_68;
  _Vector_base<float,_std::allocator<float>_> local_60;
  long local_48;
  int *local_40;
  ulong local_38;
  
  local_98 = 0;
  lVar19 = 0;
  local_90 = preOrderPartial;
  local_78 = this;
  local_70 = edgeLength;
  local_68 = outCrossProducts;
  local_40 = tipStates;
  while (lVar19 < this->kPatternCount) {
    local_7c = 0.0;
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)&local_60,
               (ulong)(uint)(this->kStateCount * this->kStateCount),&local_7c,&local_99);
    pBVar8 = local_78;
    uVar5 = this->kStateCount;
    uVar6 = this->kCategoryCount;
    lVar11 = (long)this->kPartialsPaddedStateCount;
    lVar16 = (long)local_40[lVar19];
    lVar9 = (long)this->kPatternCount;
    if (local_40[lVar19] < (int)uVar5) {
      auVar22 = ZEXT816(0);
      uVar13 = (ulong)(~((int)uVar5 >> 0x1f) & uVar5);
      pfVar18 = (float *)(local_98 * lVar11 + (long)local_90);
      for (uVar15 = 0; uVar15 != (~((int)uVar6 >> 0x1f) & uVar6); uVar15 = uVar15 + 1) {
        pfVar10 = local_60._M_impl.super__Vector_impl_data._M_start + lVar16;
        fVar2 = local_90[lVar16 + (uVar15 * lVar9 + lVar19) * lVar11];
        uVar14 = 0;
        auVar25._0_4_ = (float)((double)(float)categoryRates[uVar15] * local_70);
        auVar25._4_4_ = (int)((ulong)((double)(float)categoryRates[uVar15] * local_70) >> 0x20);
        auVar25._8_8_ = 0;
        fVar3 = categoryWeights[uVar15];
        while (uVar13 != uVar14) {
          pfVar1 = pfVar18 + uVar14;
          uVar14 = uVar14 + 1;
          auVar7 = vfmadd213ss_fma(ZEXT416((uint)(fVar3 * *pfVar1)),auVar25,ZEXT416((uint)*pfVar10))
          ;
          in_ZMM4 = ZEXT1664(auVar7);
          *pfVar10 = auVar7._0_4_;
          pfVar10 = pfVar10 + (int)uVar5;
        }
        auVar22 = vfmadd231ss_fma(auVar22,ZEXT416((uint)fVar2),ZEXT416((uint)fVar3));
        pfVar18 = pfVar18 + lVar9 * lVar11;
      }
      lVar16 = lVar16 << 2;
      auVar21._0_8_ = local_78->gPatternWeights[lVar19] / (double)auVar22._0_4_;
      auVar21._8_8_ = 0;
      while (bVar20 = uVar13 != 0, uVar13 = uVar13 - 1, bVar20) {
        auVar23._0_8_ =
             (double)*(float *)((long)local_60._M_impl.super__Vector_impl_data._M_start + lVar16);
        auVar23._8_8_ = in_ZMM4._8_8_;
        auVar4._8_8_ = 0;
        auVar4._0_8_ = *(ulong *)((long)local_68 + lVar16 * 2);
        auVar22 = vfmadd213sd_fma(auVar23,auVar21,auVar4);
        *(long *)((long)local_68 + lVar16 * 2) = auVar22._0_8_;
        lVar16 = lVar16 + (long)(int)uVar5 * 4;
      }
    }
    else {
      local_48 = (long)(int)uVar5;
      auVar22 = ZEXT816(0);
      uVar15 = (ulong)(~((int)uVar5 >> 0x1f) & uVar5);
      local_38 = (ulong)(~((int)uVar6 >> 0x1f) & uVar6);
      pfVar18 = (float *)(local_98 * lVar11 + (long)local_90);
      for (uVar13 = 0; uVar13 != local_38; uVar13 = uVar13 + 1) {
        auVar26 = ZEXT1664(ZEXT816(0) << 0x40);
        fVar2 = categoryWeights[uVar13];
        for (uVar14 = 0; uVar15 != uVar14; uVar14 = uVar14 + 1) {
          auVar26 = ZEXT464((uint)(auVar26._0_4_ + pfVar18[uVar14]));
        }
        auVar27._0_4_ = (float)((double)(float)categoryRates[uVar13] * local_70);
        auVar27._4_4_ = (int)((ulong)((double)(float)categoryRates[uVar13] * local_70) >> 0x20);
        auVar27._8_8_ = 0;
        lVar16 = 0;
        for (uVar14 = 0; uVar14 != uVar15; uVar14 = uVar14 + 1) {
          for (uVar17 = 0; uVar5 != uVar17; uVar17 = uVar17 + 1) {
            auVar7 = vfmadd213ss_fma(ZEXT416((uint)(fVar2 * local_90[(uVar13 * lVar9 + lVar19) *
                                                                     lVar11 + uVar14])),auVar27,
                                     ZEXT416(*(uint *)((long)local_60._M_impl.
                                                             super__Vector_impl_data._M_start +
                                                      uVar17 * 4 + lVar16)));
            in_ZMM4 = ZEXT1664(auVar7);
            *(int *)((long)local_60._M_impl.super__Vector_impl_data._M_start + uVar17 * 4 + lVar16)
                 = auVar7._0_4_;
          }
          lVar16 = lVar16 + local_48 * 4;
        }
        auVar22 = vfmadd231ss_fma(auVar22,auVar26._0_16_,ZEXT416((uint)fVar2));
        pfVar18 = pfVar18 + lVar9 * lVar11;
      }
      auVar22._0_8_ = local_78->gPatternWeights[lVar19] / (double)auVar22._0_4_;
      auVar22._8_8_ = 0;
      pfVar10 = local_60._M_impl.super__Vector_impl_data._M_start;
      pdVar12 = local_68;
      for (uVar13 = 0; uVar13 != uVar15; uVar13 = uVar13 + 1) {
        for (uVar14 = 0; uVar5 != uVar14; uVar14 = uVar14 + 1) {
          auVar24._0_8_ = (double)pfVar10[uVar14];
          auVar24._8_8_ = in_ZMM4._8_8_;
          auVar7._8_8_ = 0;
          auVar7._0_8_ = pdVar12[uVar14];
          auVar7 = vfmadd213sd_fma(auVar24,auVar22,auVar7);
          pdVar12[uVar14] = auVar7._0_8_;
        }
        pfVar10 = pfVar10 + local_48;
        pdVar12 = pdVar12 + local_48;
      }
    }
    local_88 = lVar19;
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_60);
    local_98 = local_98 + 4;
    this = pBVar8;
    lVar19 = local_88 + 1;
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcCrossProductsStates(const int *tipStates,
                                                                const REALTYPE *preOrderPartial,
                                                                const double *categoryRates,
                                                                const REALTYPE *categoryWeights,
                                                                const double edgeLength,
                                                                double *outCrossProducts,
                                                                double *outSumSquaredDerivatives) {

    for (int pattern = 0; pattern < kPatternCount; pattern++) {

        std::vector<REALTYPE> tmp(kStateCount * kStateCount, 0.0); // TODO Handle temporary memory better

        REALTYPE patternDenominator = 0.0;

        const int state = tipStates[pattern];

        if (state < kStateCount) {

            for (int category = 0; category < kCategoryCount; category++) {

                const REALTYPE scale = (REALTYPE) categoryRates[category] * edgeLength;

                const REALTYPE weight = categoryWeights[category];
                const int patternIndex = category * kPatternCount + pattern;
                const int v = patternIndex * kPartialsPaddedStateCount;

                REALTYPE denominator = preOrderPartial[v + state];
                patternDenominator += denominator * weight;

                for (int k = 0; k < kStateCount; k++) {
                    tmp[k * kStateCount + state] += preOrderPartial[v + k] * weight * scale;
                }
            }

            const auto patternWeight = gPatternWeights[pattern] / patternDenominator;
            for (int k = 0; k < kStateCount; k++) {
                outCrossProducts[k * kStateCount + state] += tmp[k * kStateCount + state] * patternWeight;
            }

        } else { // Missing character

            for (int category = 0; category < kCategoryCount; category++) {

                const REALTYPE scale = (REALTYPE) categoryRates[category] * edgeLength;

                const REALTYPE weight = categoryWeights[category];
                const int patternIndex = category * kPatternCount + pattern;
                const int v = patternIndex * kPartialsPaddedStateCount;

                REALTYPE denominator = 0.0;
                for (int k = 0; k < kStateCount; k++) {
                    denominator += preOrderPartial[v + k];
                }
                patternDenominator += denominator * weight;

                for (int k = 0; k < kStateCount; k++) {
                    for (int j = 0; j < kStateCount; j++) {
                        tmp[k * kStateCount + j] += preOrderPartial[v + k] * weight * scale;
                    }
                }
            }

            const auto patternWeight = gPatternWeights[pattern] / patternDenominator;
            for (int k = 0; k < kStateCount; k++) {
                for (int j = 0; j < kStateCount; j++) {
                    outCrossProducts[k * kStateCount + j] += tmp[k * kStateCount + j] * patternWeight;
                }
            }
        }
    }
}